

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O2

ze_result_t
zeGetRTASParallelOperationProcAddrTable
          (ze_api_version_t version,ze_rtas_parallel_operation_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_rtas_parallel_operation_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((tracing_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((tracing_layer::context & 0xffff) <= (version & 0xffff))) {
      DAT_001891a0 = pDdiTable->pfnCreateExt;
      DAT_001891a8 = pDdiTable->pfnGetPropertiesExt;
      pDdiTable->pfnCreateExt = tracing_layer::zeRTASParallelOperationCreateExt;
      pDdiTable->pfnGetPropertiesExt = tracing_layer::zeRTASParallelOperationGetPropertiesExt;
      DAT_001891b0 = pDdiTable->pfnJoinExt;
      DAT_001891b8 = pDdiTable->pfnDestroyExt;
      pDdiTable->pfnJoinExt = tracing_layer::zeRTASParallelOperationJoinExt;
      pDdiTable->pfnDestroyExt = tracing_layer::zeRTASParallelOperationDestroyExt;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetRTASParallelOperationProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_rtas_parallel_operation_dditable_t* pDdiTable///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = tracing_layer::context.zeDdiTable.RTASParallelOperation;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(tracing_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(tracing_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreateExt                                = pDdiTable->pfnCreateExt;
    pDdiTable->pfnCreateExt                              = tracing_layer::zeRTASParallelOperationCreateExt;

    dditable.pfnGetPropertiesExt                         = pDdiTable->pfnGetPropertiesExt;
    pDdiTable->pfnGetPropertiesExt                       = tracing_layer::zeRTASParallelOperationGetPropertiesExt;

    dditable.pfnJoinExt                                  = pDdiTable->pfnJoinExt;
    pDdiTable->pfnJoinExt                                = tracing_layer::zeRTASParallelOperationJoinExt;

    dditable.pfnDestroyExt                               = pDdiTable->pfnDestroyExt;
    pDdiTable->pfnDestroyExt                             = tracing_layer::zeRTASParallelOperationDestroyExt;

    return result;
}